

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::ConsoleReporter::sectionEnded(ConsoleReporter *this,SectionStats *_sectionStats)

{
  ColourImpl *pCVar1;
  bool bVar2;
  ostream *poVar3;
  char *pcVar4;
  ColourGuard local_58;
  double local_48;
  ColourGuard guard;
  
  pcVar4 = (char *)_sectionStats;
  TablePrinter::close((this->m_tablePrinter).m_ptr,(int)_sectionStats);
  if (_sectionStats->missingAssertions == true) {
    lazyPrint(this);
    pCVar1 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    local_58.m_code = BrightRed;
    local_58.m_engaged = true;
    local_58.m_colourImpl = pCVar1;
    (*pCVar1->_vptr_ColourImpl[2])(pCVar1,0x12);
    guard.m_code = BrightRed;
    guard.m_engaged = true;
    local_58.m_engaged = false;
    guard.m_colourImpl = pCVar1;
    ColourImpl::ColourGuard::~ColourGuard(&local_58);
    pcVar4 = "\nNo assertions in test case";
    if (1 < (ulong)(((long)(this->super_StreamingReporterBase).m_sectionStack.
                           super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->super_StreamingReporterBase).m_sectionStack.
                          super__Vector_base<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x30)) {
      pcVar4 = "\nNo assertions in section";
    }
    std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream,pcVar4);
    poVar3 = std::operator<<((this->super_StreamingReporterBase).super_ReporterBase.m_stream," \'");
    poVar3 = std::operator<<(poVar3,(string *)_sectionStats);
    pcVar4 = "\'\n\n";
    std::operator<<(poVar3,"\'\n\n");
    std::ostream::flush();
    ColourImpl::ColourGuard::~ColourGuard(&guard);
  }
  local_48 = _sectionStats->durationInSeconds;
  bVar2 = shouldShowDuration((this->super_StreamingReporterBase).super_ReporterBase.
                             super_IEventListener.m_config,local_48);
  if (bVar2) {
    poVar3 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    getFormattedDuration_abi_cxx11_((string *)&guard,(Catch *)pcVar4,local_48);
    poVar3 = std::operator<<(poVar3,(string *)&guard);
    poVar3 = std::operator<<(poVar3," s: ");
    poVar3 = std::operator<<(poVar3,(string *)_sectionStats);
    std::operator<<(poVar3,'\n');
    std::ostream::flush();
    std::__cxx11::string::~string((string *)&guard);
  }
  if (this->m_headerPrinted == true) {
    this->m_headerPrinted = false;
  }
  std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::pop_back
            (&(this->super_StreamingReporterBase).m_sectionStack);
  return;
}

Assistant:

void ConsoleReporter::sectionEnded(SectionStats const& _sectionStats) {
    m_tablePrinter->close();
    if (_sectionStats.missingAssertions) {
        lazyPrint();
        auto guard =
            m_colour->guardColour( Colour::ResultError ).engage( m_stream );
        if (m_sectionStack.size() > 1)
            m_stream << "\nNo assertions in section";
        else
            m_stream << "\nNo assertions in test case";
        m_stream << " '" << _sectionStats.sectionInfo.name << "'\n\n" << std::flush;
    }
    double dur = _sectionStats.durationInSeconds;
    if (shouldShowDuration(*m_config, dur)) {
        m_stream << getFormattedDuration(dur) << " s: " << _sectionStats.sectionInfo.name << '\n' << std::flush;
    }
    if (m_headerPrinted) {
        m_headerPrinted = false;
    }
    StreamingReporterBase::sectionEnded(_sectionStats);
}